

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

int __thiscall EntryBTree::equalKeyCompareOp(EntryBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)data[1];
  pbVar5 = data + 2;
  if ((char)data[1] < '\0') {
    uVar8 = 0x80;
    do {
      bVar1 = *pbVar5;
      lVar2 = uVar7 - uVar8;
      pbVar5 = pbVar5 + 1;
      uVar8 = uVar8 << 7;
      uVar3 = lVar2 * 0x100;
      uVar7 = bVar1 | uVar3;
    } while ((uVar3 & uVar8) != 0);
  }
  uVar4 = 0xffffffff;
  if (((uint)uVar7 <= key->m_nameIndex) && (uVar4 = 1, key->m_nameIndex <= (uint)uVar7)) {
    if ((*data & 2) == 0) {
      uVar4 = key->m_extIndex;
      uVar6 = 0;
    }
    else {
      uVar7 = (ulong)*pbVar5;
      if ((char)*pbVar5 < '\0') {
        uVar8 = 0x80;
        do {
          pbVar5 = pbVar5 + 1;
          lVar2 = uVar7 - uVar8;
          uVar8 = uVar8 << 7;
          uVar3 = lVar2 * 0x100;
          uVar7 = *pbVar5 | uVar3;
        } while ((uVar3 & uVar8) != 0);
      }
      uVar4 = key->m_extIndex;
      uVar6 = (uint)uVar7;
      if (uVar4 < uVar6) {
        return -1;
      }
    }
    uVar4 = (uint)(uVar6 < uVar4);
  }
  return uVar4;
}

Assistant:

static inline uint64_t decodeBitsAndAdvance(const uint8_t*& data)
{
	uint64_t value = *data++;
	uint64_t mask = 0x80;
	while (value & mask) {
		value = ((value - mask) << 8) | (*data++);
		mask <<= 7;
	}
	return value;
}